

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O2

void __thiscall cursespp::LayoutBase::ProcessMouseEvent(LayoutBase *this)

{
  Event *in_RSI;
  
  ProcessMouseEvent((LayoutBase *)&this[-1].super_Window.title.field_2,in_RSI);
  return;
}

Assistant:

bool LayoutBase::ProcessMouseEvent(const IMouseHandler::Event& mouseEvent) {
    for (auto window : this->children) {
        auto x = window->GetX();
        auto y = window->GetY();
        auto cx = window->GetWidth();
        auto cy = window->GetHeight();
        if (mouseEvent.x >= x && mouseEvent.x < x + cx &&
            mouseEvent.y >= y && mouseEvent.y < y + cy)
        {
            auto relative = IMouseHandler::Event(mouseEvent, window.get());
            if (window->ProcessMouseEvent(relative)) {
                return true;
            }
        }
    }
    return Window::ProcessMouseEvent(mouseEvent);
}